

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
::emplace_back<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
          (SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
           *this,pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>
                 *args)

{
  ulong uVar1;
  ModportSymbol *pMVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  ulong capacity;
  
  puVar9 = (undefined8 *)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    if (*(long *)(this + 8) == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = *(long *)(this + 8) + 1;
    uVar1 = *(ulong *)(this + 0x10);
    if (capacity < uVar1 * 2) {
      capacity = uVar1 * 2;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      capacity = 0x7fffffffffffffff;
    }
    lVar8 = (long)puVar9 - *(long *)this;
    puVar5 = (undefined8 *)detail::allocArray(capacity,0x10);
    pMVar2 = args->second;
    *(undefined8 *)((long)puVar5 + lVar8) = args->first;
    ((undefined8 *)((long)puVar5 + lVar8))[1] = pMVar2;
    puVar6 = *(undefined8 **)this;
    lVar4 = *(long *)(this + 8);
    if (puVar6 + lVar4 * 2 == puVar9) {
      puVar7 = puVar5;
      if (lVar4 != 0) {
        do {
          uVar3 = puVar6[1];
          *puVar7 = *puVar6;
          puVar7[1] = uVar3;
          puVar6 = puVar6 + 2;
          puVar7 = puVar7 + 2;
        } while (puVar6 != puVar9);
      }
    }
    else {
      puVar7 = puVar5;
      if (puVar6 != puVar9) {
        do {
          uVar3 = puVar6[1];
          *puVar7 = *puVar6;
          puVar7[1] = uVar3;
          puVar6 = puVar6 + 2;
          puVar7 = puVar7 + 2;
        } while (puVar6 != puVar9);
        puVar6 = *(undefined8 **)this;
        lVar4 = *(long *)(this + 8);
      }
      if (puVar6 + lVar4 * 2 != puVar9) {
        puVar7 = (undefined8 *)((long)puVar5 + lVar8);
        do {
          uVar3 = puVar9[1];
          puVar7[2] = *puVar9;
          puVar7[3] = uVar3;
          puVar9 = puVar9 + 2;
          puVar7 = puVar7 + 2;
        } while (puVar9 != puVar6 + lVar4 * 2);
      }
    }
    if (*(SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
          **)this != this + 0x18) {
      free(*(SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
             **)this);
    }
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = capacity;
    *(undefined8 **)this = puVar5;
    return (reference)((long)puVar5 + lVar8);
  }
  pMVar2 = args->second;
  *puVar9 = args->first;
  puVar9[1] = pMVar2;
  lVar4 = *(long *)(this + 8) + 1;
  *(long *)(this + 8) = lVar4;
  if (lVar4 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<std::pair<const slang::ast::InterfacePortSymbol *, const slang::ast::ModportSymbol *>>::back() [T = std::pair<const slang::ast::InterfacePortSymbol *, const slang::ast::ModportSymbol *>]"
              );
  }
  return (reference)(lVar4 * 0x10 + *(long *)this + -0x10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }